

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g12s.c
# Opt level: O0

err_t g12sParamsVal(g12s_params *params)

{
  err_t eVar1;
  bool_t bVar2;
  word *in_RDI;
  void *stack;
  ec_o *ec;
  void *in_stack_00000010;
  err_t code;
  g12s_deep_i in_stack_00000058;
  g12s_params *in_stack_00000060;
  ec_o **in_stack_00000068;
  void *stack_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  stack_00 = (void *)0x0;
  eVar1 = g12sEcCreate(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  if (eVar1 == 0) {
    bVar2 = ecpIsValid((ec_o *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI)
    ;
    if ((((bVar2 == 0) || (bVar2 = ecpSeemsValidGroup((ec_o *)params,in_stack_00000010), bVar2 == 0)
         ) || (bVar2 = ecpIsSafeGroup((ec_o *)CONCAT44(in_stack_fffffffffffffffc,
                                                       in_stack_fffffffffffffff8),(size_t)in_RDI,
                                      (void *)CONCAT44(eVar1,in_stack_ffffffffffffffe8)), bVar2 == 0
              )) ||
       (((bVar2 = ecHasOrderA((word *)stack,
                              (ec_o *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                              in_RDI,CONCAT44(eVar1,in_stack_ffffffffffffffe8),stack_00), bVar2 == 0
         || (bVar2 = wwIsZero(*(word **)((long)stack_00 + 0x20),
                              *(size_t *)(*(long *)((long)stack_00 + 0x18) + 0x30)), bVar2 != 0)) ||
        (bVar2 = wwIsZero(*(word **)((long)stack_00 + 0x28),
                          *(size_t *)(*(long *)((long)stack_00 + 0x18) + 0x30)), bVar2 != 0)))) {
      eVar1 = 0x1f6;
    }
    g12sEcClose((ec_o *)0x1669e3);
  }
  return eVar1;
}

Assistant:

err_t g12sParamsVal(const g12s_params* params)
{
	err_t code;
	// состояние
	ec_o* ec = 0;
	void* stack;
	// старт
	code = g12sEcCreate(&ec, params, g12sParamsVal_deep);
	ERR_CALL_CHECK(code);
	stack = objEnd(ec, void);
	// проверить кривую, проверить J(E)
	if (!ecpIsValid(ec, stack) ||
		!ecpSeemsValidGroup(ec, stack) ||
		!ecpIsSafeGroup(ec, params->l == 256 ? 31 : 131, stack) ||
		!ecHasOrderA(ec->base, ec, ec->order, ec->f->n, stack) ||
		qrIsZero(ec->A, ec->f) || 
		qrIsZero(ec->B, ec->f))
		code = ERR_BAD_PARAMS;
	// завершение
	g12sEcClose(ec);
	return code;
}